

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O1

void __thiscall gdsForge::gdsBegin(gdsForge *this)

{
  int *arrInt;
  int tempArr [1];
  int local_3c;
  string local_38;
  
  local_3c = 600;
  GDSwriteInt(this,2,&local_3c,1);
  arrInt = gsdTime();
  GDSwriteInt(this,0x102,arrInt,0xc);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ColdFlux.db","");
  GDSwriteStr(this,0x206,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  GDSwriteUnits(this);
  return;
}

Assistant:

void gdsForge::gdsBegin()
{
  int tempArr[1];

  tempArr[0] = 600;
  this->GDSwriteInt(GDS_HEADER, tempArr, 1);

  this->GDSwriteInt(GDS_BGNLIB, gsdTime(), 12);

  this->GDSwriteStr(GDS_LIBNAME, "ColdFlux.db");

  this->GDSwriteUnits();
  // Precision error, ultra fine...
  // double dArr[2] = {0.001, 1e-9};
  // GDSwriteRea(GDS_UNITS, dArr, 2);
}